

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O0

void __thiscall
myEmployeeBoss::myEmployeeBoss(myEmployeeBoss *this,int m_age,double m_wages,bool m_is_dumb)

{
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  byte local_21;
  double dStack_20;
  bool m_is_dumb_local;
  double m_wages_local;
  myEmployeeBoss *pmStack_10;
  int m_age_local;
  myEmployeeBoss *this_local;
  
  local_21 = m_is_dumb;
  dStack_20 = m_wages;
  m_wages_local._4_4_ = m_age;
  pmStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"John",&local_49);
  myEmployee::myEmployee(&this->super_myEmployee,m_age,m_wages,ATHLETIC,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  (this->super_myEmployee)._vptr_myEmployee = (_func_int **)&PTR__myEmployeeBoss_001d6260;
  this->is_dumb = (bool)(local_21 & 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"John",&local_81);
  myEmployee::myEmployee(&this->slave,0x15,300.0,ATHLETIC,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  return;
}

Assistant:

myEmployeeBoss(int m_age = 38, double m_wages = 9000.4, bool m_is_dumb = true)
        : myEmployee(m_age, m_wages), 
        is_dumb(m_is_dumb),
        slave(21, 300){}